

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O0

void strict_fstream::detail::static_method_holder::check_mode(string *filename,openmode mode)

{
  _Ios_Openmode _Var1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  _Ios_Openmode in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  Exception *in_stack_fffffffffffffe90;
  Exception *this;
  undefined1 local_151 [103];
  undefined1 local_ea;
  undefined1 local_e9 [100];
  undefined1 local_85;
  allocator local_71;
  string local_70 [100];
  _Ios_Openmode local_c;
  
  local_c = in_ESI;
  _Var1 = std::operator&(in_ESI,_S_trunc);
  if (_Var1 != ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
    _Var1 = std::operator&(local_c,_S_out);
    if (_Var1 == ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
      local_85 = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"strict_fstream: open(\'",&local_71);
      std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      std::operator+(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80);
      Exception::Exception(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      local_85 = 0;
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
  }
  _Var1 = std::operator&(local_c,_S_app);
  if (_Var1 != ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
    _Var1 = std::operator&(local_c,_S_out);
    if (_Var1 == ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
      local_ea = 1;
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x28);
      this = (Exception *)local_e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_e9 + 1),"strict_fstream: open(\'",(allocator *)this);
      std::operator+(pbVar3,in_stack_fffffffffffffe80);
      std::operator+(pbVar3,(char *)in_stack_fffffffffffffe80);
      Exception::Exception(this,pbVar3);
      local_ea = 0;
      __cxa_throw(pbVar3,&Exception::typeinfo,Exception::~Exception);
    }
  }
  _Var1 = std::operator&(local_c,_S_trunc);
  if (_Var1 != ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
    _Var1 = std::operator&(local_c,_S_app);
    if (_Var1 != ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
      uVar2 = __cxa_allocate_exception(0x28);
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_151;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_151 + 1),"strict_fstream: open(\'",(allocator *)pbVar3);
      std::operator+(in_stack_fffffffffffffe88,pbVar3);
      std::operator+(in_stack_fffffffffffffe88,(char *)pbVar3);
      Exception::Exception(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
    }
  }
  return;
}

Assistant:

static void check_mode(const std::string& filename, std::ios_base::openmode mode)
    {
        if ((mode & std::ios_base::trunc) && ! (mode & std::ios_base::out))
        {
            throw Exception(std::string("strict_fstream: open('") + filename + "'): mode error: trunc and not out");
        }
        else if ((mode & std::ios_base::app) && ! (mode & std::ios_base::out))
        {
            throw Exception(std::string("strict_fstream: open('") + filename + "'): mode error: app and not out");
        }
        else if ((mode & std::ios_base::trunc) && (mode & std::ios_base::app))
        {
            throw Exception(std::string("strict_fstream: open('") + filename + "'): mode error: trunc and app");
        }
     }